

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O0

int ffgpxvll(fitsfile *fptr,int datatype,LONGLONG *firstpix,LONGLONG nelem,void *nulval,void *array,
            int *anynul,int *status)

{
  int iVar1;
  long in_RCX;
  long *in_RDX;
  undefined8 unaff_RBP;
  int in_ESI;
  long in_R8;
  void *unaff_R14;
  LONGLONG unaff_retaddr;
  LONGLONG in_stack_00000008;
  undefined4 in_stack_00000010;
  int in_stack_00000014;
  fitsfile *in_stack_00000018;
  LONGLONG firstelem;
  LONGLONG dimsize;
  long inc [9];
  LONGLONG trc [9];
  LONGLONG naxes [9];
  int nullcheck;
  char cdummy;
  int ii;
  int naxis;
  int in_stack_000001b4;
  long *in_stack_000001b8;
  LONGLONG *in_stack_000001c0;
  LONGLONG *in_stack_000001c8;
  int in_stack_000001d4;
  fitsfile *in_stack_000001d8;
  void *in_stack_00000210;
  void *in_stack_00000218;
  char *in_stack_00000220;
  int *in_stack_00000228;
  int *in_stack_00000230;
  long in_stack_00007120;
  LONGLONG in_stack_00007128;
  LONGLONG in_stack_00007130;
  undefined4 in_stack_00007138;
  float in_stack_0000713c;
  undefined4 in_stack_00007140;
  int in_stack_00007144;
  fitsfile *in_stack_00007148;
  undefined4 in_stack_00007150;
  int in_stack_00007154;
  fitsfile *in_stack_00007158;
  int in_stack_00007164;
  fitsfile *in_stack_00007168;
  int in_stack_00007190;
  char in_stack_00007198;
  undefined1 in_stack_00007199;
  undefined2 in_stack_0000719a;
  undefined4 in_stack_0000719c;
  int in_stack_000071a0;
  undefined4 in_stack_000071a4;
  uchar in_stack_000071a8;
  undefined1 in_stack_000071a9;
  undefined2 in_stack_000071aa;
  undefined4 in_stack_000071ac;
  int in_stack_000071b0;
  undefined4 in_stack_000071b4;
  double *in_stack_000071b8;
  int *in_stack_000071c0;
  int *in_stack_000071c8;
  int *in_stack_000071d0;
  fitsfile *in_stack_fffffffffffffe68;
  int *in_stack_fffffffffffffe70;
  fitsfile *in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  int iVar2;
  fitsfile *in_stack_fffffffffffffe88;
  undefined1 local_148 [80];
  long local_f8 [10];
  long local_a8;
  long local_a0;
  undefined4 local_60;
  int local_58;
  int local_54;
  long local_48;
  long local_40;
  long *local_38;
  int local_2c;
  int local_1c;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  local_60 = 1;
  local_48 = in_R8;
  local_40 = in_RCX;
  local_38 = in_RDX;
  local_2c = in_ESI;
  memcpy(local_f8,&DAT_0027c4b0,0x48);
  memcpy(local_148,&DAT_0027c500,0x48);
  if ((*(int *)CONCAT44(in_stack_00000014,in_stack_00000010) < 1) && (local_40 != 0)) {
    ffgidm(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
           &in_stack_fffffffffffffe68->HDUposition);
    ffgiszll(in_stack_fffffffffffffe88,iVar2,(LONGLONG *)in_stack_fffffffffffffe78,
             in_stack_fffffffffffffe70);
    if ((local_54 == 0) || (local_a8 == 0)) {
      *(undefined4 *)CONCAT44(in_stack_00000014,in_stack_00000010) = 0x140;
      local_1c = *(int *)CONCAT44(in_stack_00000014,in_stack_00000010);
    }
    else {
      for (local_58 = 0; iVar2 = (int)((ulong)unaff_RBP >> 0x20), local_58 < local_54;
          local_58 = local_58 + 1) {
        local_f8[local_58] = local_38[local_58];
      }
      iVar1 = fits_is_compressed_image(in_stack_fffffffffffffe68,(int *)0x17d417);
      if (iVar1 == 0) {
        if (local_2c == 0xb) {
          if (local_48 == 0) {
            ffgclb(in_stack_00007158,in_stack_00007154,(LONGLONG)in_stack_00007148,
                   CONCAT44(in_stack_00007144,in_stack_00007140),
                   CONCAT44(in_stack_0000713c,in_stack_00007138),in_stack_00007130,in_stack_000071a0
                   ,in_stack_000071a8,(uchar *)CONCAT44(in_stack_000071b4,in_stack_000071b0),
                   (char *)in_stack_000071b8,in_stack_000071c0,in_stack_000071c8);
          }
          else {
            ffgclb(in_stack_00007158,in_stack_00007154,(LONGLONG)in_stack_00007148,
                   CONCAT44(in_stack_00007144,in_stack_00007140),
                   CONCAT44(in_stack_0000713c,in_stack_00007138),in_stack_00007130,in_stack_000071a0
                   ,in_stack_000071a8,(uchar *)CONCAT44(in_stack_000071b4,in_stack_000071b0),
                   (char *)in_stack_000071b8,in_stack_000071c0,in_stack_000071c8);
          }
        }
        else if (local_2c == 0xc) {
          if (local_48 == 0) {
            ffgclsb(in_stack_00007148,in_stack_00007144,
                    CONCAT44(in_stack_0000713c,in_stack_00007138),in_stack_00007130,
                    in_stack_00007128,in_stack_00007120,in_stack_00007190,in_stack_00007198,
                    (char *)CONCAT44(in_stack_000071a4,in_stack_000071a0),
                    (char *)CONCAT44(in_stack_000071ac,
                                     CONCAT22(in_stack_000071aa,
                                              CONCAT11(in_stack_000071a9,in_stack_000071a8))),
                    (int *)CONCAT44(in_stack_000071b4,in_stack_000071b0),(int *)in_stack_000071b8);
          }
          else {
            ffgclsb(in_stack_00007148,in_stack_00007144,
                    CONCAT44(in_stack_0000713c,in_stack_00007138),in_stack_00007130,
                    in_stack_00007128,in_stack_00007120,in_stack_00007190,in_stack_00007198,
                    (char *)CONCAT44(in_stack_000071a4,in_stack_000071a0),
                    (char *)CONCAT44(in_stack_000071ac,
                                     CONCAT22(in_stack_000071aa,
                                              CONCAT11(in_stack_000071a9,in_stack_000071a8))),
                    (int *)CONCAT44(in_stack_000071b4,in_stack_000071b0),(int *)in_stack_000071b8);
          }
        }
        else if (local_2c == 0x14) {
          if (local_48 == 0) {
            ffgclui(in_stack_00007148,in_stack_00007144,
                    CONCAT44(in_stack_0000713c,in_stack_00007138),in_stack_00007130,
                    in_stack_00007128,in_stack_00007120,in_stack_00007190,
                    CONCAT11(in_stack_00007199,in_stack_00007198),
                    (unsigned_short *)CONCAT44(in_stack_000071a4,in_stack_000071a0),
                    (char *)CONCAT44(in_stack_000071ac,
                                     CONCAT22(in_stack_000071aa,
                                              CONCAT11(in_stack_000071a9,in_stack_000071a8))),
                    (int *)CONCAT44(in_stack_000071b4,in_stack_000071b0),(int *)in_stack_000071b8);
          }
          else {
            ffgclui(in_stack_00007148,in_stack_00007144,
                    CONCAT44(in_stack_0000713c,in_stack_00007138),in_stack_00007130,
                    in_stack_00007128,in_stack_00007120,in_stack_00007190,
                    CONCAT11(in_stack_00007199,in_stack_00007198),
                    (unsigned_short *)CONCAT44(in_stack_000071a4,in_stack_000071a0),
                    (char *)CONCAT44(in_stack_000071ac,
                                     CONCAT22(in_stack_000071aa,
                                              CONCAT11(in_stack_000071a9,in_stack_000071a8))),
                    (int *)CONCAT44(in_stack_000071b4,in_stack_000071b0),(int *)in_stack_000071b8);
          }
        }
        else if (local_2c == 0x15) {
          if (local_48 == 0) {
            ffgcli(in_stack_00007158,in_stack_00007154,(LONGLONG)in_stack_00007148,
                   CONCAT44(in_stack_00007144,in_stack_00007140),
                   CONCAT44(in_stack_0000713c,in_stack_00007138),in_stack_00007130,in_stack_000071a0
                   ,CONCAT11(in_stack_000071a9,in_stack_000071a8),
                   (short *)CONCAT44(in_stack_000071b4,in_stack_000071b0),(char *)in_stack_000071b8,
                   in_stack_000071c0,in_stack_000071c8);
          }
          else {
            ffgcli(in_stack_00007158,in_stack_00007154,(LONGLONG)in_stack_00007148,
                   CONCAT44(in_stack_00007144,in_stack_00007140),
                   CONCAT44(in_stack_0000713c,in_stack_00007138),in_stack_00007130,in_stack_000071a0
                   ,CONCAT11(in_stack_000071a9,in_stack_000071a8),
                   (short *)CONCAT44(in_stack_000071b4,in_stack_000071b0),(char *)in_stack_000071b8,
                   in_stack_000071c0,in_stack_000071c8);
          }
        }
        else if (local_2c == 0x1e) {
          if (local_48 == 0) {
            ffgcluk(in_stack_00007148,in_stack_00007144,
                    CONCAT44(in_stack_0000713c,in_stack_00007138),in_stack_00007130,
                    in_stack_00007128,in_stack_00007120,in_stack_00007190,
                    CONCAT22(in_stack_0000719a,CONCAT11(in_stack_00007199,in_stack_00007198)),
                    (uint *)CONCAT44(in_stack_000071a4,in_stack_000071a0),
                    (char *)CONCAT44(in_stack_000071ac,
                                     CONCAT22(in_stack_000071aa,
                                              CONCAT11(in_stack_000071a9,in_stack_000071a8))),
                    (int *)CONCAT44(in_stack_000071b4,in_stack_000071b0),(int *)in_stack_000071b8);
          }
          else {
            ffgcluk(in_stack_00007148,in_stack_00007144,
                    CONCAT44(in_stack_0000713c,in_stack_00007138),in_stack_00007130,
                    in_stack_00007128,in_stack_00007120,in_stack_00007190,
                    CONCAT22(in_stack_0000719a,CONCAT11(in_stack_00007199,in_stack_00007198)),
                    (uint *)CONCAT44(in_stack_000071a4,in_stack_000071a0),
                    (char *)CONCAT44(in_stack_000071ac,
                                     CONCAT22(in_stack_000071aa,
                                              CONCAT11(in_stack_000071a9,in_stack_000071a8))),
                    (int *)CONCAT44(in_stack_000071b4,in_stack_000071b0),(int *)in_stack_000071b8);
          }
        }
        else if (local_2c == 0x1f) {
          if (local_48 == 0) {
            ffgclk(in_stack_00007158,in_stack_00007154,(LONGLONG)in_stack_00007148,
                   CONCAT44(in_stack_00007144,in_stack_00007140),
                   CONCAT44(in_stack_0000713c,in_stack_00007138),in_stack_00007130,in_stack_000071a0
                   ,CONCAT22(in_stack_000071aa,CONCAT11(in_stack_000071a9,in_stack_000071a8)),
                   (int *)CONCAT44(in_stack_000071b4,in_stack_000071b0),(char *)in_stack_000071b8,
                   in_stack_000071c0,in_stack_000071c8);
          }
          else {
            ffgclk(in_stack_00007158,in_stack_00007154,(LONGLONG)in_stack_00007148,
                   CONCAT44(in_stack_00007144,in_stack_00007140),
                   CONCAT44(in_stack_0000713c,in_stack_00007138),in_stack_00007130,in_stack_000071a0
                   ,CONCAT22(in_stack_000071aa,CONCAT11(in_stack_000071a9,in_stack_000071a8)),
                   (int *)CONCAT44(in_stack_000071b4,in_stack_000071b0),(char *)in_stack_000071b8,
                   in_stack_000071c0,in_stack_000071c8);
          }
        }
        else if (local_2c == 0x28) {
          if (local_48 == 0) {
            ffgcluj(in_stack_00007148,in_stack_00007144,
                    CONCAT44(in_stack_0000713c,in_stack_00007138),in_stack_00007130,
                    in_stack_00007128,in_stack_00007120,in_stack_00007190,
                    CONCAT44(in_stack_0000719c,
                             CONCAT22(in_stack_0000719a,
                                      CONCAT11(in_stack_00007199,in_stack_00007198))),
                    (unsigned_long *)CONCAT44(in_stack_000071a4,in_stack_000071a0),
                    (char *)CONCAT44(in_stack_000071ac,
                                     CONCAT22(in_stack_000071aa,
                                              CONCAT11(in_stack_000071a9,in_stack_000071a8))),
                    (int *)CONCAT44(in_stack_000071b4,in_stack_000071b0),(int *)in_stack_000071b8);
          }
          else {
            ffgcluj(in_stack_00007148,in_stack_00007144,
                    CONCAT44(in_stack_0000713c,in_stack_00007138),in_stack_00007130,
                    in_stack_00007128,in_stack_00007120,in_stack_00007190,
                    CONCAT44(in_stack_0000719c,
                             CONCAT22(in_stack_0000719a,
                                      CONCAT11(in_stack_00007199,in_stack_00007198))),
                    (unsigned_long *)CONCAT44(in_stack_000071a4,in_stack_000071a0),
                    (char *)CONCAT44(in_stack_000071ac,
                                     CONCAT22(in_stack_000071aa,
                                              CONCAT11(in_stack_000071a9,in_stack_000071a8))),
                    (int *)CONCAT44(in_stack_000071b4,in_stack_000071b0),(int *)in_stack_000071b8);
          }
        }
        else if (local_2c == 0x29) {
          if (local_48 == 0) {
            ffgclj(in_stack_00007158,in_stack_00007154,(LONGLONG)in_stack_00007148,
                   CONCAT44(in_stack_00007144,in_stack_00007140),
                   CONCAT44(in_stack_0000713c,in_stack_00007138),in_stack_00007130,in_stack_000071a0
                   ,CONCAT44(in_stack_000071ac,
                             CONCAT22(in_stack_000071aa,
                                      CONCAT11(in_stack_000071a9,in_stack_000071a8))),
                   (long *)CONCAT44(in_stack_000071b4,in_stack_000071b0),(char *)in_stack_000071b8,
                   in_stack_000071c0,in_stack_000071c8);
          }
          else {
            ffgclj(in_stack_00007158,in_stack_00007154,(LONGLONG)in_stack_00007148,
                   CONCAT44(in_stack_00007144,in_stack_00007140),
                   CONCAT44(in_stack_0000713c,in_stack_00007138),in_stack_00007130,in_stack_000071a0
                   ,CONCAT44(in_stack_000071ac,
                             CONCAT22(in_stack_000071aa,
                                      CONCAT11(in_stack_000071a9,in_stack_000071a8))),
                   (long *)CONCAT44(in_stack_000071b4,in_stack_000071b0),(char *)in_stack_000071b8,
                   in_stack_000071c0,in_stack_000071c8);
          }
        }
        else if (local_2c == 0x50) {
          if (local_48 == 0) {
            ffgclujj(in_stack_00007158,in_stack_00007154,(LONGLONG)in_stack_00007148,
                     CONCAT44(in_stack_00007144,in_stack_00007140),
                     CONCAT44(in_stack_0000713c,in_stack_00007138),in_stack_00007130,
                     in_stack_000071a0,
                     CONCAT44(in_stack_000071ac,
                              CONCAT22(in_stack_000071aa,
                                       CONCAT11(in_stack_000071a9,in_stack_000071a8))),
                     (ULONGLONG *)CONCAT44(in_stack_000071b4,in_stack_000071b0),
                     (char *)in_stack_000071b8,in_stack_000071c0,in_stack_000071c8);
          }
          else {
            ffgclujj(in_stack_00007158,in_stack_00007154,(LONGLONG)in_stack_00007148,
                     CONCAT44(in_stack_00007144,in_stack_00007140),
                     CONCAT44(in_stack_0000713c,in_stack_00007138),in_stack_00007130,
                     in_stack_000071a0,
                     CONCAT44(in_stack_000071ac,
                              CONCAT22(in_stack_000071aa,
                                       CONCAT11(in_stack_000071a9,in_stack_000071a8))),
                     (ULONGLONG *)CONCAT44(in_stack_000071b4,in_stack_000071b0),
                     (char *)in_stack_000071b8,in_stack_000071c0,in_stack_000071c8);
          }
        }
        else if (local_2c == 0x51) {
          if (local_48 == 0) {
            ffgcljj(in_stack_00007158,in_stack_00007154,(LONGLONG)in_stack_00007148,
                    CONCAT44(in_stack_00007144,in_stack_00007140),
                    CONCAT44(in_stack_0000713c,in_stack_00007138),in_stack_00007130,
                    in_stack_000071a0,
                    CONCAT44(in_stack_000071ac,
                             CONCAT22(in_stack_000071aa,
                                      CONCAT11(in_stack_000071a9,in_stack_000071a8))),
                    (LONGLONG *)CONCAT44(in_stack_000071b4,in_stack_000071b0),
                    (char *)in_stack_000071b8,in_stack_000071c0,in_stack_000071c8);
          }
          else {
            ffgcljj(in_stack_00007158,in_stack_00007154,(LONGLONG)in_stack_00007148,
                    CONCAT44(in_stack_00007144,in_stack_00007140),
                    CONCAT44(in_stack_0000713c,in_stack_00007138),in_stack_00007130,
                    in_stack_000071a0,
                    CONCAT44(in_stack_000071ac,
                             CONCAT22(in_stack_000071aa,
                                      CONCAT11(in_stack_000071a9,in_stack_000071a8))),
                    (LONGLONG *)CONCAT44(in_stack_000071b4,in_stack_000071b0),
                    (char *)in_stack_000071b8,in_stack_000071c0,in_stack_000071c8);
          }
        }
        else if (local_2c == 0x2a) {
          if (local_48 == 0) {
            ffgcle(in_stack_00007168,in_stack_00007164,(LONGLONG)in_stack_00007158,
                   CONCAT44(in_stack_00007154,in_stack_00007150),(LONGLONG)in_stack_00007148,
                   CONCAT44(in_stack_00007144,in_stack_00007140),in_stack_000071b0,in_stack_0000713c
                   ,(float *)in_stack_000071b8,(char *)in_stack_000071c0,in_stack_000071c8,
                   in_stack_000071d0);
          }
          else {
            ffgcle(in_stack_00007168,in_stack_00007164,(LONGLONG)in_stack_00007158,
                   CONCAT44(in_stack_00007154,in_stack_00007150),(LONGLONG)in_stack_00007148,
                   CONCAT44(in_stack_00007144,in_stack_00007140),in_stack_000071b0,in_stack_0000713c
                   ,(float *)in_stack_000071b8,(char *)in_stack_000071c0,in_stack_000071c8,
                   in_stack_000071d0);
          }
        }
        else if (local_2c == 0x52) {
          if (local_48 == 0) {
            ffgcld(in_stack_00007168,in_stack_00007164,(LONGLONG)in_stack_00007158,
                   CONCAT44(in_stack_00007154,in_stack_00007150),(LONGLONG)in_stack_00007148,
                   CONCAT44(in_stack_00007144,in_stack_00007140),in_stack_000071b0,
                   (double)CONCAT44(in_stack_0000713c,in_stack_00007138),in_stack_000071b8,
                   (char *)in_stack_000071c0,in_stack_000071c8,in_stack_000071d0);
          }
          else {
            ffgcld(in_stack_00007168,in_stack_00007164,(LONGLONG)in_stack_00007158,
                   CONCAT44(in_stack_00007154,in_stack_00007150),(LONGLONG)in_stack_00007148,
                   CONCAT44(in_stack_00007144,in_stack_00007140),in_stack_000071b0,
                   (double)CONCAT44(in_stack_0000713c,in_stack_00007138),in_stack_000071b8,
                   (char *)in_stack_000071c0,in_stack_000071c8,in_stack_000071d0);
          }
        }
        else {
          *(undefined4 *)CONCAT44(in_stack_00000014,in_stack_00000010) = 0x19a;
        }
        local_1c = *(int *)CONCAT44(in_stack_00000014,in_stack_00000010);
      }
      else {
        if ((((local_54 < 2) || (3 < local_54)) || (*local_38 != 1)) ||
           ((local_40 / local_a8) * local_a8 - local_40 != 0)) {
          fits_read_compressed_pixels
                    (in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr,iVar2,
                     unaff_R14,(void *)inc[2],(char *)inc[3],(int *)inc[4],(int *)inc[5]);
        }
        else {
          local_f8[0] = local_a8;
          for (local_f8[1] = local_38[1] + local_40 / local_a8 + -1; local_a0 < local_f8[1];
              local_f8[1] = local_f8[1] - local_a0) {
            local_f8[2] = local_f8[2] + 1;
          }
          fits_read_compressed_img
                    (in_stack_000001d8,in_stack_000001d4,in_stack_000001c8,in_stack_000001c0,
                     in_stack_000001b8,in_stack_000001b4,in_stack_00000210,in_stack_00000218,
                     in_stack_00000220,in_stack_00000228,in_stack_00000230);
        }
        local_1c = *(int *)CONCAT44(in_stack_00000014,in_stack_00000010);
      }
    }
  }
  else {
    local_1c = *(int *)CONCAT44(in_stack_00000014,in_stack_00000010);
  }
  return local_1c;
}

Assistant:

int ffgpxvll( fitsfile *fptr, /* I - FITS file pointer                       */
            int  datatype,    /* I - datatype of the value                   */
            LONGLONG *firstpix, /* I - coord of first pixel to read (1s based) */
            LONGLONG nelem,   /* I - number of values to read                */
            void *nulval,     /* I - value for undefined pixels              */
            void *array,      /* O - array of values that are returned       */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from the primary array. The datatype of the
  input array is defined by the 2nd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Undefined elements will be set equal to NULVAL, unless NULVAL=0
  in which case no checking for undefined values will be performed.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{
    int naxis, ii;
    char cdummy;
    int nullcheck = 1;
    LONGLONG naxes[9], trc[9]= {1,1,1,1,1,1,1,1,1};
    long inc[9]= {1,1,1,1,1,1,1,1,1};
    LONGLONG dimsize = 1, firstelem;

    if (*status > 0 || nelem == 0)   /* inherit input status value if > 0 */
        return(*status);

    /* get the size of the image */
    ffgidm(fptr, &naxis, status);

    ffgiszll(fptr, 9, naxes, status);

    if (naxis == 0 || naxes[0] == 0) {
       *status = BAD_DIMEN;
       return(*status);
    }

    /* calculate the position of the first element in the array */
    firstelem = 0;
    for (ii=0; ii < naxis; ii++)
    {
        firstelem += ((firstpix[ii] - 1) * dimsize);
        dimsize *= naxes[ii];
        trc[ii] = firstpix[ii];
    }
    firstelem++;

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        /* test for special case of reading an integral number of */
        /* rows in a 2D or 3D image (which includes reading the whole image */

	if (naxis > 1 && naxis < 4 && firstpix[0] == 1 &&
            (nelem / naxes[0]) * naxes[0] == nelem) {

                /* calculate coordinate of last pixel */
		trc[0] = naxes[0];  /* reading whole rows */
		trc[1] = firstpix[1] + (nelem / naxes[0] - 1);
                while (trc[1] > naxes[1])  {
		    trc[1] = trc[1] - naxes[1];
		    trc[2] = trc[2] + 1;  /* increment to next plane of cube */
                }

                fits_read_compressed_img(fptr, datatype, firstpix, trc, inc,
                   1, nulval, array, NULL, anynul, status);

        } else {

                fits_read_compressed_pixels(fptr, datatype, firstelem,
                   nelem, nullcheck, nulval, array, NULL, anynul, status);
        }

        return(*status);
    }

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    if (datatype == TBYTE)
    {
      if (nulval == 0)
        ffgclb(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (unsigned char *) array, &cdummy, anynul, status);
      else
        ffgclb(fptr, 2, 1, firstelem, nelem, 1, 1, *(unsigned char *) nulval,
               (unsigned char *) array, &cdummy, anynul, status);
    }
    else if (datatype == TSBYTE)
    {
      if (nulval == 0)
        ffgclsb(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (signed char *) array, &cdummy, anynul, status);
      else
        ffgclsb(fptr, 2, 1, firstelem, nelem, 1, 1, *(signed char *) nulval,
               (signed char *) array, &cdummy, anynul, status);
    }
    else if (datatype == TUSHORT)
    {
      if (nulval == 0)
        ffgclui(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (unsigned short *) array, &cdummy, anynul, status);
      else
        ffgclui(fptr, 2, 1, firstelem, nelem, 1, 1, *(unsigned short *) nulval,
               (unsigned short *) array, &cdummy, anynul, status);
    }
    else if (datatype == TSHORT)
    {
      if (nulval == 0)
        ffgcli(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (short *) array, &cdummy, anynul, status);
      else
        ffgcli(fptr, 2, 1, firstelem, nelem, 1, 1, *(short *) nulval,
               (short *) array, &cdummy, anynul, status);
    }
    else if (datatype == TUINT)
    {
      if (nulval == 0)
        ffgcluk(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (unsigned int *) array, &cdummy, anynul, status);
      else
        ffgcluk(fptr, 2, 1, firstelem, nelem, 1, 1, *(unsigned int *) nulval,
               (unsigned int *) array, &cdummy, anynul, status);
    }
    else if (datatype == TINT)
    {
      if (nulval == 0)
        ffgclk(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (int *) array, &cdummy, anynul, status);
      else
        ffgclk(fptr, 2, 1, firstelem, nelem, 1, 1, *(int *) nulval,
               (int *) array, &cdummy, anynul, status);
    }
    else if (datatype == TULONG)
    {
      if (nulval == 0)
        ffgcluj(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (unsigned long *) array, &cdummy, anynul, status);
      else
        ffgcluj(fptr, 2, 1, firstelem, nelem, 1, 1, *(unsigned long *) nulval,
               (unsigned long *) array, &cdummy, anynul, status);
    }
    else if (datatype == TLONG)
    {
      if (nulval == 0)
        ffgclj(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (long *) array, &cdummy, anynul, status);
      else
        ffgclj(fptr, 2, 1, firstelem, nelem, 1, 1, *(long *) nulval,
               (long *) array, &cdummy, anynul, status);
    }
    else if (datatype == TULONGLONG)
    {
      if (nulval == 0)
        ffgclujj(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (ULONGLONG *) array, &cdummy, anynul, status);
      else
        ffgclujj(fptr, 2, 1, firstelem, nelem, 1, 1, *(ULONGLONG *) nulval,
               (ULONGLONG *) array, &cdummy, anynul, status);
    }
    else if (datatype == TLONGLONG)
    {
      if (nulval == 0)
        ffgcljj(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (LONGLONG *) array, &cdummy, anynul, status);
      else
        ffgcljj(fptr, 2, 1, firstelem, nelem, 1, 1, *(LONGLONG *) nulval,
               (LONGLONG *) array, &cdummy, anynul, status);
    }
    else if (datatype == TFLOAT)
    {
      if (nulval == 0)
        ffgcle(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (float *) array, &cdummy, anynul, status);
      else
        ffgcle(fptr, 2, 1, firstelem, nelem, 1, 1, *(float *) nulval,
               (float *) array, &cdummy, anynul, status);
    }
    else if (datatype == TDOUBLE)
    {
      if (nulval == 0)
        ffgcld(fptr, 2, 1, firstelem, nelem, 1, 1, 0,
               (double *) array, &cdummy, anynul, status);
      else
        ffgcld(fptr, 2, 1, firstelem, nelem, 1, 1, *(double *) nulval,
               (double *) array, &cdummy, anynul, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}